

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O3

Function<std::tuple<int,_int>_(),_false> * __thiscall
crampl::detail::Function<std::tuple<int,int>(),false>::operator=
          (Function<std::tuple<int,int>(),false> *this,
          Function<std::tuple<int,_int>_(),_false> *_rhs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  
  (**(code **)(this + 0x10))(this,0);
  uVar1 = *(undefined4 *)((long)&_rhs->invoke + 4);
  uVar2 = *(undefined4 *)&_rhs->manager;
  uVar3 = *(undefined4 *)((long)&_rhs->manager + 4);
  *(undefined4 *)(this + 8) = *(undefined4 *)&_rhs->invoke;
  *(undefined4 *)(this + 0xc) = uVar1;
  *(undefined4 *)(this + 0x10) = uVar2;
  *(undefined4 *)(this + 0x14) = uVar3;
  _rhs->manager = Function<std::tuple<int,_int>_(),_false>::noop_manager;
  _rhs->invoke = Function<std::tuple<int,_int>_(),_false>::bad_invoke;
  (**(code **)(this + 0x10))(_rhs,this);
  return (Function<std::tuple<int,_int>_(),_false> *)this;
}

Assistant:

Function& operator=(T&& _rhs) noexcept {
		destroy();
		init_from(std::forward<T>(_rhs));
		return *this;
	}